

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int get_closure_var2(JSContext *ctx,JSFunctionDef *s,JSFunctionDef *fd,BOOL is_local,BOOL is_arg,
                    int var_idx,JSAtom var_name,BOOL is_const,BOOL is_lexical,JSVarKindEnum var_kind
                    )

{
  uint in_ECX;
  JSFunctionDef *in_RDX;
  JSContext *in_RSI;
  BOOL in_EDI;
  uint in_R8D;
  uint in_R9D;
  JSAtom unaff_retaddr;
  BOOL in_stack_00000008;
  BOOL in_stack_00000010;
  JSVarKindEnum in_stack_00000018;
  JSAtom in_stack_00000020;
  JSClosureVar *cv;
  int i;
  JSAtom in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  BOOL in_stack_ffffffffffffffb8;
  BOOL in_stack_ffffffffffffffbc;
  JSFunctionDef *in_stack_ffffffffffffffc0;
  BOOL in_stack_ffffffffffffffc8;
  int iVar1;
  JSVarKindEnum in_stack_fffffffffffffff0;
  
  if (in_RDX != (JSFunctionDef *)(in_RSI->header).link.prev) {
    in_R9D = get_closure_var2(in_RSI,in_RDX,(JSFunctionDef *)CONCAT44(in_ECX,in_R8D),in_R9D,
                              in_stack_ffffffffffffffc8,
                              (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),unaff_retaddr,
                              in_stack_00000008,in_stack_00000010,in_stack_00000018);
    if ((int)in_R9D < 0) {
      return -1;
    }
    in_ECX = 0;
    in_stack_ffffffffffffffb0 = in_stack_00000020;
  }
  iVar1 = 0;
  while( true ) {
    if (*(int *)&(in_RSI->loaded_modules).prev <= iVar1) {
      iVar1 = add_closure_var((JSContext *)CONCAT44(in_R9D,iVar1),in_stack_ffffffffffffffc0,
                              in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                              in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,(BOOL)in_RSI,
                              in_EDI,in_stack_fffffffffffffff0);
      return iVar1;
    }
    in_stack_ffffffffffffffc0 = (JSFunctionDef *)(&((in_RSI->loaded_modules).next)->prev + iVar1);
    if (((*(ushort *)((long)&in_stack_ffffffffffffffc0->ctx + 2) == in_R9D) &&
        ((*(byte *)&in_stack_ffffffffffffffc0->ctx >> 1 & 1) == in_R8D)) &&
       ((*(byte *)&in_stack_ffffffffffffffc0->ctx & 1) == in_ECX)) break;
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

static int get_closure_var2(JSContext *ctx, JSFunctionDef *s,
                            JSFunctionDef *fd, BOOL is_local,
                            BOOL is_arg, int var_idx, JSAtom var_name,
                            BOOL is_const, BOOL is_lexical,
                            JSVarKindEnum var_kind)
{
    int i;

    if (fd != s->parent) {
        var_idx = get_closure_var2(ctx, s->parent, fd, is_local,
                                   is_arg, var_idx, var_name,
                                   is_const, is_lexical, var_kind);
        if (var_idx < 0)
            return -1;
        is_local = FALSE;
    }
    for(i = 0; i < s->closure_var_count; i++) {
        JSClosureVar *cv = &s->closure_var[i];
        if (cv->var_idx == var_idx && cv->is_arg == is_arg &&
            cv->is_local == is_local)
            return i;
    }
    return add_closure_var(ctx, s, is_local, is_arg, var_idx, var_name,
                           is_const, is_lexical, var_kind);
}